

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O0

path * __thiscall
Process::Normalise(path *__return_storage_ptr__,Process *this,int fd,path *path,path *cwd)

{
  bool bVar1;
  path *ppVar2;
  undefined1 local_158 [8];
  path canonicalParent;
  path file;
  path parent;
  path canonical;
  path local_d0;
  path local_b0;
  path local_90;
  undefined1 local_60 [8];
  path fullPath;
  error_code ec;
  path *cwd_local;
  path *path_local;
  int fd_local;
  Process *this_local;
  
  boost::system::error_code::error_code((error_code *)((long)&fullPath.m_pathname.field_2 + 8));
  boost::filesystem::path::path((path *)local_60);
  bVar1 = boost::filesystem::path::is_relative(path);
  if (bVar1) {
    if (fd != -100) {
      GetFd(&local_d0,this,fd);
      boost::filesystem::operator/(&local_b0,&local_d0,path);
      ppVar2 = boost::filesystem::path::normalize(&local_b0);
      boost::filesystem::path::path(__return_storage_ptr__,ppVar2);
      boost::filesystem::path::~path(&local_b0);
      boost::filesystem::path::~path(&local_d0);
      goto LAB_00115570;
    }
    boost::filesystem::operator/(&local_90,cwd,path);
    ppVar2 = boost::filesystem::path::normalize(&local_90);
    boost::filesystem::path::operator=((path *)local_60,ppVar2);
    boost::filesystem::path::~path(&local_90);
  }
  else {
    boost::filesystem::path::operator=((path *)local_60,path);
  }
  boost::filesystem::canonical
            ((path *)((long)&parent.m_pathname.field_2 + 8),(path *)local_60,
             (error_code *)((long)&fullPath.m_pathname.field_2 + 8));
  bVar1 = boost::system::error_code::operator_cast_to_bool
                    ((error_code *)((long)&fullPath.m_pathname.field_2 + 8));
  if (bVar1) {
    boost::filesystem::path::parent_path();
    boost::filesystem::path::filename();
    boost::filesystem::canonical
              ((path *)local_158,(path *)((long)&file.m_pathname.field_2 + 8),
               (error_code *)((long)&fullPath.m_pathname.field_2 + 8));
    bVar1 = boost::system::error_code::operator_cast_to_bool
                      ((error_code *)((long)&fullPath.m_pathname.field_2 + 8));
    if (bVar1) {
      boost::filesystem::path::path(__return_storage_ptr__,(path *)local_60);
    }
    else {
      boost::filesystem::operator/
                (__return_storage_ptr__,(path *)local_158,
                 (path *)((long)&canonicalParent.m_pathname.field_2 + 8));
    }
    boost::filesystem::path::~path((path *)local_158);
    boost::filesystem::path::~path((path *)((long)&canonicalParent.m_pathname.field_2 + 8));
    boost::filesystem::path::~path((path *)((long)&file.m_pathname.field_2 + 8));
  }
  else {
    boost::filesystem::path::path
              (__return_storage_ptr__,(path *)((long)&parent.m_pathname.field_2 + 8));
  }
  boost::filesystem::path::~path((path *)((long)&parent.m_pathname.field_2 + 8));
LAB_00115570:
  boost::filesystem::path::~path((path *)local_60);
  return __return_storage_ptr__;
}

Assistant:

fs::path Process::Normalise(int fd, const fs::path &path, const fs::path &cwd)
{
  boost::system::error_code ec;

  // Get rid of the relative path.
  fs::path fullPath;
  if (path.is_relative()) {
    if (fd == AT_FDCWD) {
      fullPath = (cwd / path).normalize();
    } else {
      return (GetFd(fd) / path).normalize();
    }
  } else {
    fullPath = path;
  }

  // If the file exists, return the canonical path.
  const fs::path canonical = fs::canonical(fullPath, ec);
  if (!ec) {
    return canonical;
  }

  // If the file was deleted, try to canonicalise the parent.
  const fs::path parent = fullPath.parent_path();
  const fs::path file = fullPath.filename();

  const fs::path canonicalParent = fs::canonical(parent, ec);
  if (!ec) {
    return canonicalParent / file;
  }

  return fullPath;
}